

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O2

void ZSTD_buildFSETable(ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,
                       U32 *baseValue,U32 *nbAdditionalBits,uint tableLog)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  undefined4 uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  U32 tableMask;
  ushort uVar8;
  U32 s;
  uint uVar9;
  ulong uVar10;
  ushort auStack_a8 [24];
  U16 symbolNext [53];
  
  uVar4 = 1;
  bVar2 = (byte)tableLog;
  uVar7 = 1 << (bVar2 & 0x1f);
  uVar6 = (ulong)(uVar7 - 1);
  for (uVar10 = 0; maxSymbolValue + 1 != uVar10; uVar10 = uVar10 + 1) {
    uVar8 = normalizedCounter[uVar10];
    if ((short)uVar8 == -1) {
      dt[uVar6 + 1].baseValue = (U32)uVar10;
      uVar8 = 1;
      uVar6 = (ulong)((uint)uVar6 - 1);
    }
    else if ((0x10000 << (bVar2 - 1 & 0x1f)) >> 0x10 <= (int)(short)uVar8) {
      uVar4 = 0;
    }
    auStack_a8[uVar10] = uVar8;
  }
  dt->nextState = (short)uVar4;
  dt->nbAdditionalBits = (char)((uint)uVar4 >> 0x10);
  dt->nbBits = (char)((uint)uVar4 >> 0x18);
  dt->baseValue = tableLog;
  uVar5 = 0;
  for (uVar10 = 0; uVar10 != maxSymbolValue + 1; uVar10 = uVar10 + 1) {
    uVar8 = normalizedCounter[uVar10];
    uVar9 = 0;
    if ((short)uVar8 < 1) {
      uVar8 = 0;
    }
    for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      dt[(ulong)uVar5 + 1].baseValue = (U32)uVar10;
      do {
        uVar5 = uVar5 + (uVar7 >> 1) + (uVar7 >> 3) + 3 & uVar7 - 1;
      } while ((uint)uVar6 < uVar5);
    }
  }
  for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    uVar5 = dt[uVar6 + 1].baseValue;
    uVar8 = auStack_a8[uVar5];
    auStack_a8[uVar5] = uVar8 + 1;
    iVar1 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    bVar3 = bVar2 - (char)iVar1;
    dt[uVar6 + 1].nbBits = bVar3;
    dt[uVar6 + 1].nextState = (uVar8 << (bVar3 & 0x1f)) - (short)uVar7;
    dt[uVar6 + 1].nbAdditionalBits = (BYTE)nbAdditionalBits[uVar5];
    dt[uVar6 + 1].baseValue = baseValue[uVar5];
  }
  return;
}

Assistant:

void
ZSTD_buildFSETable(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U32* nbAdditionalBits,
            unsigned tableLog)
{
    ZSTD_seqSymbol* const tableDecode = dt+1;
    U16 symbolNext[MaxSeq+1];

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    assert(maxSymbolValue <= MaxSeq);
    assert(tableLog <= MaxFSELog);

    /* Init, lay down lowprob symbols */
    {   ZSTD_seqSymbol_header DTableH;
        DTableH.tableLog = tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].baseValue = s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    symbolNext[s] = normalizedCounter[s];
        }   }   }
        memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    {   U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].baseValue = s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        assert(position == 0); /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            U32 const symbol = tableDecode[u].baseValue;
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - BIT_highbit32(nextState) );
            tableDecode[u].nextState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
            assert(nbAdditionalBits[symbol] < 255);
            tableDecode[u].nbAdditionalBits = (BYTE)nbAdditionalBits[symbol];
            tableDecode[u].baseValue = baseValue[symbol];
    }   }
}